

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_> *
__thiscall
sf::String::toUtf16_abi_cxx11_
          (basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
           *__return_storage_ptr__,String *this)

{
  __normal_iterator<const_unsigned_int_*,_std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
  begin;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = 0;
  std::__cxx11::
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>::
  reserve(__return_storage_ptr__,(this->m_string)._M_string_length);
  begin._M_current = (this->m_string)._M_dataplus._M_p;
  Utf<32u>::
  toUtf16<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::__cxx11::basic_string<unsigned_int,std::char_traits<unsigned_int>,std::allocator<unsigned_int>>>,std::back_insert_iterator<std::__cxx11::basic_string<unsigned_short,std::char_traits<unsigned_short>,std::allocator<unsigned_short>>>>
            (begin,(__normal_iterator<const_unsigned_int_*,_std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
                    )(begin._M_current + (this->m_string)._M_string_length),
             (back_insert_iterator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>
              )__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<Uint16> String::toUtf16() const
{
    // Prepare the output string
    std::basic_string<Uint16> output;
    output.reserve(m_string.length());

    // Convert
    Utf32::toUtf16(m_string.begin(), m_string.end(), std::back_inserter(output));

    return output;
}